

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

vector<CKeyID,_std::allocator<CKeyID>_> * __thiscall XOnlyPubKey::GetKeyIDs(XOnlyPubKey *this)

{
  long lVar1;
  uchar *__result;
  CPubKey *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  vector<CKeyID,_std::allocator<CKeyID>_> *out;
  CPubKey fullpubkey;
  uchar b [33];
  CPubKey *in_stack_fffffffffffffef8;
  CPubKey *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<CKeyID,_std::allocator<CKeyID>_>::vector
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffef8);
  base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffef8);
  __result = base_blob<256U>::end((base_blob<256U> *)in_stack_fffffffffffffef8);
  std::copy<unsigned_char_const*,unsigned_char*>(this_00->vch,in_RDI->vch,__result);
  CPubKey::CPubKey(in_stack_fffffffffffffef8);
  CPubKey::Set<unsigned_char*>(this_00,in_RDI->vch,__result);
  CPubKey::GetID(in_RSI);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffef8,
             (value_type *)0xe84336);
  CPubKey::Set<unsigned_char*>(this_00,in_RDI->vch,__result);
  CPubKey::GetID(in_RSI);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffef8,
             (value_type *)0xe84382);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<CKeyID,_std::allocator<CKeyID>_> *)this_00;
}

Assistant:

std::vector<CKeyID> XOnlyPubKey::GetKeyIDs() const
{
    std::vector<CKeyID> out;
    // For now, use the old full pubkey-based key derivation logic. As it is indexed by
    // Hash160(full pubkey), we need to return both a version prefixed with 0x02, and one
    // with 0x03.
    unsigned char b[33] = {0x02};
    std::copy(m_keydata.begin(), m_keydata.end(), b + 1);
    CPubKey fullpubkey;
    fullpubkey.Set(b, b + 33);
    out.push_back(fullpubkey.GetID());
    b[0] = 0x03;
    fullpubkey.Set(b, b + 33);
    out.push_back(fullpubkey.GetID());
    return out;
}